

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

char * __thiscall cmMakefile::CompileFeaturesAvailable(cmMakefile *this,string *lang,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *pcVar2;
  bool bVar3;
  long *plVar4;
  string *psVar5;
  ostream *poVar6;
  _func_int **pp_Var7;
  size_type *psVar8;
  char *pcVar9;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  bVar3 = cmGlobalGenerator::GetLanguageEnabled(this->GlobalGenerator,lang);
  if (bVar3) {
    std::operator+(&local_220,"CMAKE_",lang);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_220);
    pp_Var7 = (_func_int **)(plVar4 + 2);
    if ((_func_int **)*plVar4 == pp_Var7) {
      local_190[0]._0_8_ = *pp_Var7;
      local_190[0]._8_8_ = plVar4[3];
      local_1a0._0_8_ = local_1a0 + 0x10;
    }
    else {
      local_190[0]._0_8_ = *pp_Var7;
      local_1a0._0_8_ = (_func_int **)*plVar4;
    }
    local_1a0._8_8_ = plVar4[1];
    *plVar4 = (long)pp_Var7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    psVar5 = GetDef(this,(string *)local_1a0);
    if (psVar5 == (string *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = (psVar5->_M_dataplus)._M_p;
    }
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,(ulong)(local_190[0]._M_allocated_capacity + 1));
    }
    paVar1 = &local_220.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
      return pcVar9;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    pcVar9 = "no";
    if (error == (string *)0x0) {
      pcVar9 = "No";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar9,2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," known features for ",0x14);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," compiler\n\"",0xb);
    std::operator+(&local_1c0,"CMAKE_",lang);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_220.field_2._M_allocated_capacity = *psVar8;
      local_220.field_2._8_8_ = plVar4[3];
      local_220._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_220.field_2._M_allocated_capacity = *psVar8;
      local_220._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_220._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    psVar5 = GetSafeDefinition(this,&local_220);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\nversion ",10);
    std::operator+(&local_1e0,"CMAKE_",lang);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_200.field_2._M_allocated_capacity = *psVar8;
      local_200.field_2._8_8_ = plVar4[3];
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    }
    else {
      local_200.field_2._M_allocated_capacity = *psVar8;
      local_200._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_200._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    psVar5 = GetSafeDefinition(this,&local_200);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (error == (string *)0x0) {
      pcVar2 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_220,&this->Backtrace);
    }
    else {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)error,(string *)&local_220);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p == paVar1) goto LAB_0023910e;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    pcVar9 = "cannot";
    if (error == (string *)0x0) {
      pcVar9 = "Cannot";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar9,6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," use features from non-enabled language ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    if (error == (string *)0x0) {
      pcVar2 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_220,&this->Backtrace);
    }
    else {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)error,(string *)&local_220);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p == &local_220.field_2) goto LAB_0023910e;
  }
  operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
LAB_0023910e:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return (char *)0x0;
}

Assistant:

const char* cmMakefile::CompileFeaturesAvailable(const std::string& lang,
                                                 std::string* error) const
{
  if (!this->GlobalGenerator->GetLanguageEnabled(lang)) {
    std::ostringstream e;
    if (error) {
      e << "cannot";
    } else {
      e << "Cannot";
    }
    e << " use features from non-enabled language " << lang;
    if (error) {
      *error = e.str();
    } else {
      this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                             this->Backtrace);
    }
    return nullptr;
  }

  const char* featuresKnown =
    this->GetDefinition("CMAKE_" + lang + "_COMPILE_FEATURES");

  if (!featuresKnown || !*featuresKnown) {
    std::ostringstream e;
    if (error) {
      e << "no";
    } else {
      e << "No";
    }
    e << " known features for " << lang << " compiler\n\""
      << this->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_VERSION") << ".";
    if (error) {
      *error = e.str();
    } else {
      this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                             this->Backtrace);
    }
    return nullptr;
  }
  return featuresKnown;
}